

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O3

type jsoncons::binary::
     native_to_big<int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
               (int val,back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        d_first)

{
  long lVar1;
  uint8_t buf [4];
  uchar local_1d;
  uint local_1c;
  
  local_1c = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
  lVar1 = 0;
  do {
    local_1d = *(uchar *)((long)&local_1c + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((d_first.container)->buf_ptr,&local_1d);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_big(T val, OutputIt d_first)
    {
        T val2 = byte_swap(val);
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val2, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }